

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Vector<float,_4> __thiscall tcu::operator*(tcu *this,Vector<float,_2> *vec,Matrix<float,_2,_4> *mtx)

{
  float *pfVar1;
  ulong extraout_XMM0_Qa;
  ulong uVar2;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar3;
  int local_2c;
  float local_28;
  int row;
  float v;
  int col;
  Matrix<float,_2,_4> *mtx_local;
  Vector<float,_2> *vec_local;
  Vector<float,_4> *res;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar2 = extraout_XMM0_Qa;
  for (row = 0; row < 4; row = row + 1) {
    local_28 = 0.0;
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pfVar1 = Matrix<float,_2,_4>::operator()(mtx,local_2c,row);
      in_XMM1_Qa = (ulong)(uint)local_28;
      local_28 = *pfVar1 * vec->m_data[local_2c] + local_28;
    }
    uVar2 = (ulong)(uint)local_28;
    *(float *)(this + (long)row * 4) = local_28;
  }
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = (float)(int)uVar2;
  VVar3.m_data[1] = (float)(int)(uVar2 >> 0x20);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

Vector<T, Cols> operator* (const Vector<T, Rows>& vec, const Matrix<T, Rows, Cols>& mtx)
{
	Vector<T, Cols> res;
	for (int col = 0; col < Cols; col++)
	{
		T v = T(0);
		for (int row = 0; row < Rows; row++)
			v += mtx(row,col) * vec.m_data[row];
		res.m_data[col] = v;
	}
	return res;
}